

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O0

void __thiscall
llm_build_olmo2::llm_build_olmo2
          (llm_build_olmo2 *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  uint uVar1;
  undefined8 uVar2;
  ggml_tensor *wo_b;
  ggml_tensor *pgVar3;
  ggml_tensor *pgVar4;
  ggml_tensor *pgVar5;
  ggml_tensor *pgVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  ggml_tensor *name;
  ggml_tensor *pgVar9;
  ggml_tensor *pgVar10;
  ggml_tensor *pgVar11;
  const_reference pvVar12;
  pointer plVar13;
  ggml_tensor *in_RCX;
  ggml_tensor *in_RDX;
  ggml_tensor *in_RSI;
  ggml_tensor *in_RDI;
  int unaff_retaddr;
  ggml_tensor *ffn_inp;
  ggml_tensor *inp_out_ids;
  ggml_tensor *Vcur;
  ggml_tensor *Kcur;
  ggml_tensor *Qcur;
  ggml_tensor *inpSA;
  int il;
  llm_graph_input_attn_kv_unified *inp_attn;
  ggml_tensor *inp_pos;
  ggml_tensor *inpL;
  ggml_tensor *cur;
  int64_t n_embd_head;
  ggml_tensor *in_stack_fffffffffffffdd8;
  int iVar14;
  llm_graph_context *in_stack_fffffffffffffde0;
  ggml_tensor *in_stack_fffffffffffffde8;
  ggml_tensor *mb;
  ggml_tensor *in_stack_fffffffffffffdf0;
  ggml_tensor *mw;
  ggml_tensor *in_stack_fffffffffffffdf8;
  undefined4 uVar15;
  llm_graph_context *in_stack_fffffffffffffe00;
  ggml_tensor *in_stack_fffffffffffffe30;
  ggml_tensor *in_stack_fffffffffffffe38;
  ggml_tensor *in_stack_fffffffffffffe40;
  ggml_tensor *in_stack_fffffffffffffe58;
  ggml_tensor *pgVar16;
  ggml_tensor *in_stack_fffffffffffffe80;
  ggml_tensor *in_stack_fffffffffffffe90;
  ggml_tensor *in_stack_fffffffffffffe98;
  ggml_tensor *in_stack_fffffffffffffea0;
  llm_ffn_op_type type_op;
  llm_ffn_gate_type type_gate;
  int il_00;
  ggml_tensor *in_stack_fffffffffffffee8;
  llm_graph_context *in_stack_fffffffffffffef0;
  ggml_tensor *local_68;
  float kq_scale;
  ggml_tensor *pgVar17;
  llm_graph_input_attn_kv_unified *in_stack_ffffffffffffffc8;
  llm_graph_context *in_stack_ffffffffffffffd0;
  
  pgVar17 = in_RDI;
  llm_graph_context::llm_graph_context
            ((llm_graph_context *)in_stack_fffffffffffffdf0,
             (llm_graph_params *)in_stack_fffffffffffffde8);
  uVar1 = *(uint *)(in_RDI->buffer + 0x24);
  if (uVar1 != *(uint *)(in_RDI->buffer + 0x20)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
               ,0x23f3,"GGML_ASSERT(%s) failed","n_embd_head == hparams.n_embd_head_k");
  }
  if (uVar1 != *(uint *)(in_RDI->buffer + 0x14)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
               ,0x23f4,"GGML_ASSERT(%s) failed","n_embd_head == hparams.n_rot");
  }
  local_68 = llm_graph_context::build_inp_embd(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  wo_b = llm_graph_context::build_inp_pos((llm_graph_context *)in_stack_fffffffffffffe40);
  pgVar3 = (ggml_tensor *)
           llm_graph_context::build_attn_inp_kv_unified
                     ((llm_graph_context *)in_stack_fffffffffffffe80);
  for (kq_scale = 0.0; iVar14 = (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20),
      (long)(int)kq_scale < in_RDI->ne[3]; kq_scale = (float)((int)kq_scale + 1)) {
    pgVar16 = local_68;
    pgVar10 = local_68;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)&in_RSI[0x13].view_offs,
               (long)(int)kq_scale);
    llm_graph_context::build_lora_mm
              ((llm_graph_context *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
               in_stack_fffffffffffffe30);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
               (char *)in_stack_fffffffffffffde0,iVar14);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)&in_RSI[0x13].view_offs,
               (long)(int)kq_scale);
    llm_graph_context::build_lora_mm
              ((llm_graph_context *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
               in_stack_fffffffffffffe30);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
               (char *)in_stack_fffffffffffffde0,iVar14);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)&in_RSI[0x13].view_offs,
               (long)(int)kq_scale);
    pgVar4 = llm_graph_context::build_lora_mm
                       ((llm_graph_context *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                        in_stack_fffffffffffffe30);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
               (char *)in_stack_fffffffffffffde0,iVar14);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)&in_RSI[0x13].view_offs,
               (long)(int)kq_scale);
    pgVar5 = llm_graph_context::build_norm
                       (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                        in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                        (llm_norm_type)((ulong)in_stack_fffffffffffffde0 >> 0x20),
                        (int)in_stack_fffffffffffffde0);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
               (char *)in_stack_fffffffffffffde0,iVar14);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)&in_RSI[0x13].view_offs,
               (long)(int)kq_scale);
    pgVar6 = llm_graph_context::build_norm
                       (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                        in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                        (llm_norm_type)((ulong)in_stack_fffffffffffffde0 >> 0x20),
                        (int)in_stack_fffffffffffffde0);
    uVar15 = (undefined4)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
               (char *)in_stack_fffffffffffffde0,iVar14);
    uVar7 = ggml_reshape_3d(in_RDI->src[5],pgVar5,uVar1,in_RDI->nb[3],
                            (long)*(int *)(in_RDI->src + 2));
    uVar8._0_4_ = in_RDI->op;
    uVar8._4_4_ = in_RDI->op_params[0];
    uVar8 = ggml_reshape_3d(in_RDI->src[5],pgVar6,uVar1,uVar8,(long)*(int *)(in_RDI->src + 2));
    uVar2._0_4_ = in_RDI->op;
    uVar2._4_4_ = in_RDI->op_params[0];
    name = (ggml_tensor *)
           ggml_reshape_3d(in_RDI->src[5],pgVar4,uVar1,uVar2,(long)*(int *)(in_RDI->src + 2));
    ggml_rope_ext(in_RDI->op_params[0xd],in_RDI->op_params[0xe],in_RDI->op_params[0xf],in_RDI->flags
                  ,*(undefined4 *)in_RDI->src,*(undefined4 *)((long)in_RDI->src + 4),in_RDI->src[5],
                  uVar7,wo_b,0,(int)in_RDI->nb[0],*(undefined4 *)(in_RDI->src + 4));
    pgVar9 = (ggml_tensor *)
             ggml_rope_ext(in_RDI->op_params[0xd],in_RDI->op_params[0xe],in_RDI->op_params[0xf],
                           in_RDI->flags,*(undefined4 *)in_RDI->src,
                           *(undefined4 *)((long)in_RDI->src + 4),in_RDI->src[5],uVar8,wo_b,0,
                           (int)in_RDI->nb[0],*(undefined4 *)(in_RDI->src + 4));
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
               (char *)in_stack_fffffffffffffde0,iVar14);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
               (char *)in_stack_fffffffffffffde0,iVar14);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
               (char *)in_stack_fffffffffffffde0,iVar14);
    pgVar5 = pgVar3;
    pgVar6 = in_RCX;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)&in_RSI[0x13].view_offs,
               (long)(int)kq_scale);
    il_00 = (int)in_RCX;
    type_gate = (llm_ffn_gate_type)pgVar3;
    sqrtf((float)uVar1);
    pgVar11 = (ggml_tensor *)CONCAT44(uVar15,kq_scale);
    mw = (ggml_tensor *)0x0;
    mb = (ggml_tensor *)0x0;
    pgVar4 = name;
    pgVar3 = pgVar9;
    pgVar10 = llm_graph_context::build_attn
                        (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(ggml_cgraph *)pgVar10,
                         pgVar16,wo_b,pgVar5,pgVar6,in_RDX,in_RSI,pgVar17,kq_scale,unaff_retaddr);
    type_op = (llm_ffn_op_type)pgVar3;
    iVar14 = (int)((ulong)pgVar9 >> 0x20);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)&in_RSI[0x13].view_offs,
               (long)(int)kq_scale);
    pgVar9 = llm_graph_context::build_norm
                       (in_stack_fffffffffffffe00,pgVar11,mw,mb,(llm_norm_type)((ulong)name >> 0x20)
                        ,(int)name);
    pgVar16 = pgVar9;
    llm_graph_context::cb((llm_graph_context *)mw,mb,(char *)name,iVar14);
    pgVar3 = pgVar5;
    in_RCX = pgVar6;
    if ((long)(int)kq_scale == in_RDI->ne[3] + -1) {
      pgVar3 = llm_graph_context::build_inp_out_ids((llm_graph_context *)in_stack_fffffffffffffe30);
      in_stack_fffffffffffffea0 = pgVar3;
      in_stack_fffffffffffffe98 = (ggml_tensor *)ggml_get_rows(in_RDI->src[5],pgVar16,pgVar3);
      pgVar16 = in_stack_fffffffffffffe98;
      in_stack_fffffffffffffe90 = (ggml_tensor *)ggml_get_rows(in_RDI->src[5],local_68,pgVar3);
      local_68 = in_stack_fffffffffffffe90;
      pgVar3 = pgVar5;
      in_RCX = pgVar6;
    }
    pgVar11 = (ggml_tensor *)ggml_add(in_RDI->src[5],pgVar16,local_68);
    llm_graph_context::cb((llm_graph_context *)mw,mb,(char *)name,iVar14);
    pgVar6 = pgVar11;
    pvVar12 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                        ((vector<llama_layer,_std::allocator<llama_layer>_> *)
                         &in_RSI[0x13].view_offs,(long)(int)kq_scale);
    pgVar5 = pvVar12->ffn_up;
    pvVar12 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                        ((vector<llama_layer,_std::allocator<llama_layer>_> *)
                         &in_RSI[0x13].view_offs,(long)(int)kq_scale);
    pgVar16 = pvVar12->ffn_gate;
    pvVar12 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                        ((vector<llama_layer,_std::allocator<llama_layer>_> *)
                         &in_RSI[0x13].view_offs,(long)(int)kq_scale);
    in_stack_fffffffffffffde8 = pvVar12->ffn_down;
    in_stack_fffffffffffffe00 = (llm_graph_context *)0x0;
    in_stack_fffffffffffffdf8 = (ggml_tensor *)0x0;
    in_stack_fffffffffffffdf0 = (ggml_tensor *)0x0;
    in_stack_fffffffffffffde0 = (llm_graph_context *)0x0;
    in_stack_fffffffffffffdd8 = (ggml_tensor *)0x0;
    in_stack_fffffffffffffe80 =
         llm_graph_context::build_ffn
                   ((llm_graph_context *)in_stack_fffffffffffffe80,
                    (ggml_tensor *)&stack0xfffffffffffffdd8,pgVar16,pgVar5,pgVar6,
                    in_stack_fffffffffffffe58,in_stack_fffffffffffffe90,in_stack_fffffffffffffe98,
                    in_stack_fffffffffffffea0,pgVar10,pgVar9,pgVar4,type_op,type_gate,il_00);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
               (char *)in_stack_fffffffffffffde0,(int)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)&in_RSI[0x13].view_offs,
               (long)(int)kq_scale);
    in_stack_fffffffffffffe58 =
         llm_graph_context::build_norm
                   (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                    in_stack_fffffffffffffde8,
                    (llm_norm_type)((ulong)in_stack_fffffffffffffde0 >> 0x20),
                    (int)in_stack_fffffffffffffde0);
    pgVar4 = in_stack_fffffffffffffe58;
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
               (char *)in_stack_fffffffffffffde0,(int)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
    ggml_add(in_RDI->src[5],pgVar4,pgVar11);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
               (char *)in_stack_fffffffffffffde0,(int)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
    in_stack_fffffffffffffe40 =
         llm_graph_context::build_cvec(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,0);
    local_68 = in_stack_fffffffffffffe40;
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
               (char *)in_stack_fffffffffffffde0,(int)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
  }
  pgVar3 = llm_graph_context::build_norm
                     (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                      in_stack_fffffffffffffde8,
                      (llm_norm_type)((ulong)in_stack_fffffffffffffde0 >> 0x20),
                      (int)in_stack_fffffffffffffde0);
  pgVar17 = pgVar3;
  llm_graph_context::cb
            ((llm_graph_context *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
             (char *)in_stack_fffffffffffffde0,iVar14);
  plVar13 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                      ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                       0x4e687b);
  plVar13->t_embd = pgVar17;
  pgVar3 = llm_graph_context::build_lora_mm
                     ((llm_graph_context *)in_stack_fffffffffffffe40,pgVar3,
                      in_stack_fffffffffffffe30);
  llm_graph_context::cb
            ((llm_graph_context *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
             (char *)in_stack_fffffffffffffde0,iVar14);
  pgVar17 = pgVar3;
  plVar13 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                      ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                       0x4e6900);
  plVar13->t_logits = pgVar3;
  ggml_build_forward_expand(in_RCX,pgVar17);
  return;
}

Assistant:

llm_build_olmo2(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_graph_context(params) {
        const int64_t n_embd_head = hparams.n_embd_head_v;

        GGML_ASSERT(n_embd_head == hparams.n_embd_head_k);
        GGML_ASSERT(n_embd_head == hparams.n_rot);

        ggml_tensor * cur;
        ggml_tensor * inpL;

        inpL = build_inp_embd(model.tok_embd);

        // inp_pos - contains the positions
        ggml_tensor * inp_pos = build_inp_pos();

        auto * inp_attn = build_attn_inp_kv_unified();

        for (int il = 0; il < n_layer; ++il) {
            ggml_tensor * inpSA = inpL;

            cur = inpL;

            // self_attention
            {
                // compute Q and K and RoPE them
                ggml_tensor * Qcur = build_lora_mm(model.layers[il].wq, cur);
                cb(Qcur, "Qcur", il);

                ggml_tensor * Kcur = build_lora_mm(model.layers[il].wk, cur);
                cb(Kcur, "Kcur", il);

                ggml_tensor * Vcur = build_lora_mm(model.layers[il].wv, cur);
                cb(Vcur, "Vcur", il);

                Qcur = build_norm(Qcur, model.layers[il].attn_q_norm, NULL,
                        LLM_NORM_RMS, il);
                cb(Qcur, "Qcur_normed", il);

                Kcur = build_norm(Kcur, model.layers[il].attn_k_norm, NULL,
                        LLM_NORM_RMS, il);
                cb(Kcur, "Kcur_normed", il);

                Qcur = ggml_reshape_3d(ctx0, Qcur, n_embd_head, n_head,    n_tokens);
                Kcur = ggml_reshape_3d(ctx0, Kcur, n_embd_head, n_head_kv, n_tokens);
                Vcur = ggml_reshape_3d(ctx0, Vcur, n_embd_head, n_head_kv, n_tokens);

                Qcur = ggml_rope_ext(
                        ctx0, Qcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                Kcur = ggml_rope_ext(
                        ctx0, Kcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                cb(Qcur, "Qcur", il);
                cb(Kcur, "Kcur", il);
                cb(Vcur, "Vcur", il);

                cur = build_attn(inp_attn, gf,
                        model.layers[il].wo, NULL,
                        Qcur, Kcur, Vcur, nullptr, nullptr, 1.0f/sqrtf(float(n_embd_head)), il);
            }

            cur = build_norm(cur,
                    model.layers[il].attn_post_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "attn_post_norm", il);

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                ggml_tensor * inp_out_ids = build_inp_out_ids();
                cur   = ggml_get_rows(ctx0,   cur, inp_out_ids);
                inpSA = ggml_get_rows(ctx0, inpSA, inp_out_ids);
            }

            ggml_tensor * ffn_inp = ggml_add(ctx0, cur, inpSA);
            cb(ffn_inp, "ffn_inp", il);

            // feed-forward network
            cur = build_ffn(ffn_inp,
                    model.layers[il].ffn_up,   NULL, NULL,
                    model.layers[il].ffn_gate, NULL, NULL,
                    model.layers[il].ffn_down, NULL, NULL,
                    NULL,
                    LLM_FFN_SILU, LLM_FFN_PAR, il);
            cb(cur, "ffn_out", il);

            cur = build_norm(cur,
                    model.layers[il].ffn_post_norm, NULL,
                    LLM_NORM_RMS, -1);
            cb(cur, "ffn_post_norm", -1);

            cur = ggml_add(ctx0, cur, ffn_inp);
            cb(cur, "ffn_out", il);

            cur = build_cvec(cur, il);
            cb(cur, "l_out", il);

            // input for next layer
            inpL = cur;
        }

        cur = inpL;

        cur = build_norm(cur,
                model.output_norm, NULL,
                LLM_NORM_RMS, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        // lm_head
        cur = build_lora_mm(model.output, cur);

        cb(cur, "result_output", -1);
        res->t_logits = cur;

        ggml_build_forward_expand(gf, cur);
    }